

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadapi_pthreads.c
# Opt level: O0

THREADAPI_RESULT ThreadAPI_Create(THREAD_HANDLE *threadHandle,THREAD_START_FUNC func,void *arg)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  pthread_t *__newthread;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  int createResult;
  LOGGER_LOG l_1;
  THREAD_INSTANCE *threadInstance;
  LOGGER_LOG l;
  THREADAPI_RESULT result;
  void *arg_local;
  THREAD_START_FUNC func_local;
  THREAD_HANDLE *threadHandle_local;
  
  if ((threadHandle == (THREAD_HANDLE *)0x0) || (func == (THREAD_START_FUNC)0x0)) {
    l._4_4_ = THREADAPI_INVALID_ARG;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar3 = THREADAPI_RESULTStrings(THREADAPI_INVALID_ARG);
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/threadapi_pthreads.c"
                ,"ThreadAPI_Create",0x2f,1,"(result = %s%s (%d))","",pcVar3,2);
    }
  }
  else {
    __newthread = (pthread_t *)malloc(0x18);
    if (__newthread == (pthread_t *)0x0) {
      l._4_4_ = THREADAPI_NO_MEMORY;
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar3 = THREADAPI_RESULTStrings(THREADAPI_NO_MEMORY);
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/threadapi_pthreads.c"
                  ,"ThreadAPI_Create",0x37,1,"(result = %s%s (%d))","",pcVar3,3);
      }
    }
    else {
      __newthread[1] = (pthread_t)func;
      __newthread[2] = (pthread_t)arg;
      iVar1 = pthread_create(__newthread,(pthread_attr_t *)0x0,ThreadWrapper,__newthread);
      if (iVar1 == 0) {
        *threadHandle = __newthread;
        l._4_4_ = THREADAPI_OK;
      }
      else if (iVar1 == 0xb) {
        free(__newthread);
        l._4_4_ = THREADAPI_NO_MEMORY;
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar3 = THREADAPI_RESULTStrings(THREADAPI_NO_MEMORY);
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/threadapi_pthreads.c"
                    ,"ThreadAPI_Create",0x50,1,"(result = %s%s (%d))","",pcVar3,3);
        }
      }
      else {
        free(__newthread);
        l._4_4_ = THREADAPI_ERROR;
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar3 = THREADAPI_RESULTStrings(THREADAPI_ERROR);
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/threadapi_pthreads.c"
                    ,"ThreadAPI_Create",0x44,1,"(result = %s%s (%d))","",pcVar3,4);
        }
      }
    }
  }
  return l._4_4_;
}

Assistant:

THREADAPI_RESULT ThreadAPI_Create(THREAD_HANDLE* threadHandle, THREAD_START_FUNC func, void* arg)
{
    THREADAPI_RESULT result;

    if ((threadHandle == NULL) ||
        (func == NULL))
    {
        result = THREADAPI_INVALID_ARG;
        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(THREADAPI_RESULT, result));
    }
    else
    {
        THREAD_INSTANCE* threadInstance = malloc(sizeof(THREAD_INSTANCE));
        if (threadInstance == NULL)
        {
            result = THREADAPI_NO_MEMORY;
            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(THREADAPI_RESULT, result));
        }
        else
        {
            threadInstance->ThreadStartFunc = func;
            threadInstance->Arg = arg;
            int createResult = pthread_create(&threadInstance->Pthread_handle, NULL, ThreadWrapper, threadInstance);
            switch (createResult)
            {
            default:
                free(threadInstance);

                result = THREADAPI_ERROR;
                LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(THREADAPI_RESULT, result));
                break;

            case 0:
                *threadHandle = threadInstance;
                result = THREADAPI_OK;
                break;

            case EAGAIN:
                free(threadInstance);

                result = THREADAPI_NO_MEMORY;
                LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(THREADAPI_RESULT, result));
                break;
            }
        }
    }

    return result;
}